

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport_p.h
# Opt level: O1

qreal __thiscall KDReports::HeaderMap::height(HeaderMap *this)

{
  QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>
  *pQVar1;
  TextDocument *this_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  qreal qVar5;
  double dVar6;
  
  pQVar1 = (this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>).d.d;
  if (pQVar1 == (QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>
                 *)0x0) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  pQVar1 = (this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>).d.d;
  p_Var3 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>
                 *)0x0) {
    p_Var3 = (_Base_ptr)0x0;
  }
  if (p_Var2 == p_Var3) {
    qVar5 = 0.0;
  }
  else {
    qVar5 = 0.0;
    do {
      dVar6 = qVar5;
      this_00 = Header::doc((Header *)p_Var2[1]._M_parent);
      TextDocument::contentDocument(this_00);
      QTextDocument::size();
      if (dVar6 <= qVar5) {
        dVar6 = qVar5;
      }
      qVar5 = dVar6;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      pQVar1 = (this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>).d.d;
      p_Var4 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar1 == (QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>
                     *)0x0) {
        p_Var4 = (_Rb_tree_node_base *)0x0;
      }
    } while (p_Var2 != p_Var4);
  }
  return qVar5;
}

Assistant:

qreal height() const
    {
        qreal maxHeight = 0;
        for (const_iterator it = begin(); it != end(); ++it) {
            Header *header = it.value();
            maxHeight = qMax(maxHeight, header->doc().contentDocument().size().height());
        }
        return maxHeight;
    }